

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

int QLocale::system(char *__command)

{
  systemData(&system::locale.m_index);
  system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._1_3_ = 0;
  system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._0_1_ = (system::locale.m_data)->m_language_id == 1;
  QLocale((QLocale *)__command,&system::locale);
  return (int)__command;
}

Assistant:

QLocale QLocale::system()
{
    constexpr auto sysData = []() {
        // Same return as systemData(), but leave the setup to the actual call to it.
#ifdef QT_NO_SYSTEMLOCALE
        return locale_data;
#else
        return &systemLocaleData;
#endif
    };
    Q_CONSTINIT static QLocalePrivate locale(sysData(), -1, DefaultNumberOptions, 1);
    // Calling systemData() ensures system data is up to date; we also need it
    // to ensure that locale's index stays up to date:
    systemData(&locale.m_index);
    Q_ASSERT(locale.m_index >= 0 && locale.m_index < locale_data_size);
    locale.m_numberOptions = defaultNumberOptions(locale.m_data->m_language_id);

    return QLocale(locale);
}